

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O0

VarId refill(map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
             *redundantphi,VarId *name)

{
  bool bVar1;
  VarId *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  Displayable in_RDI;
  VarId VVar3;
  iterator it;
  Displayable this;
  _Self local_28;
  _Self local_20 [4];
  
  this._vptr_Displayable = in_RDI._vptr_Displayable;
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
       ::find((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
               *)in_RDX,(key_type *)0x2847dd);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
       ::end((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
              *)in_RDX);
  bVar1 = std::operator==(local_20,&local_28);
  if (bVar1) {
    mir::inst::VarId::VarId((VarId *)this._vptr_Displayable,in_RDX);
    uVar2 = extraout_RDX;
  }
  else {
    std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_> *)0x284820);
    mir::inst::VarId::VarId((VarId *)this._vptr_Displayable,in_RDX);
    uVar2 = extraout_RDX_00;
  }
  VVar3._8_8_ = uVar2;
  VVar3.super_Displayable._vptr_Displayable = in_RDI._vptr_Displayable;
  return VVar3;
}

Assistant:

mir::inst::VarId refill(map<mir::inst::VarId, mir::inst::VarId> redundantphi,
                        mir::inst::VarId name) {
  map<mir::inst::VarId, mir::inst::VarId>::iterator it =
      redundantphi.find(name);
  if (it == redundantphi.end()) {
    return name;
  } else {
    return it->second;
  }
}